

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# a_sign.cc
# Opt level: O3

int ASN1_item_sign_ctx(ASN1_ITEM *it,X509_ALGOR *algor1,X509_ALGOR *algor2,
                      ASN1_BIT_STRING *signature,void *asn,EVP_MD_CTX *ctx)

{
  int iVar1;
  uint uVar2;
  EVP_PKEY *pkey;
  uint8_t *out_sig;
  int lib;
  int line;
  size_t out_len;
  uint8_t *in;
  size_t local_40;
  uchar *local_38;
  
  local_38 = (uint8_t *)0x0;
  if (signature->type == 3) {
    if ((((algor1 == (X509_ALGOR *)0x0) ||
         (iVar1 = x509_digest_sign_algorithm((EVP_MD_CTX *)ctx,(X509_ALGOR *)algor1), iVar1 != 0))
        && ((algor2 == (X509_ALGOR *)0x0 ||
            (iVar1 = x509_digest_sign_algorithm((EVP_MD_CTX *)ctx,(X509_ALGOR *)algor2), iVar1 != 0)
            ))) && (uVar2 = ASN1_item_i2d((ASN1_VALUE *)asn,&local_38,it), -1 < (int)uVar2)) {
      pkey = EVP_PKEY_CTX_get0_pkey((EVP_PKEY_CTX *)ctx->flags);
      iVar1 = EVP_PKEY_size(pkey);
      local_40 = (size_t)iVar1;
      if (iVar1 < 0) {
        lib = 0xb;
        iVar1 = 0x45;
        line = 0x45;
        goto LAB_00211e92;
      }
      out_sig = (uint8_t *)OPENSSL_malloc(local_40);
      if (out_sig != (uint8_t *)0x0) {
        iVar1 = EVP_DigestSign((EVP_MD_CTX *)ctx,out_sig,&local_40,local_38,(ulong)uVar2);
        if (iVar1 == 0) {
          iVar1 = 0;
          ERR_put_error(0xb,0,6,
                        "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/x509/a_sign.cc"
                        ,0x4f);
        }
        else {
          ASN1_STRING_set0(signature,out_sig,(int)local_40);
          signature->flags = signature->flags & 0xfffffffffffffff0U | 8;
          out_sig = (uint8_t *)0x0;
          iVar1 = (int)local_40;
        }
        goto LAB_00211e9e;
      }
    }
  }
  else {
    lib = 0xc;
    iVar1 = 0xbf;
    line = 0x31;
LAB_00211e92:
    ERR_put_error(lib,0,iVar1,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/x509/a_sign.cc"
                  ,line);
  }
  out_sig = (uint8_t *)0x0;
  iVar1 = 0;
LAB_00211e9e:
  EVP_MD_CTX_cleanup(ctx);
  OPENSSL_free(local_38);
  OPENSSL_free(out_sig);
  return iVar1;
}

Assistant:

int ASN1_item_sign_ctx(const ASN1_ITEM *it, X509_ALGOR *algor1,
                       X509_ALGOR *algor2, ASN1_BIT_STRING *signature,
                       void *asn, EVP_MD_CTX *ctx) {
  int ret = 0;
  uint8_t *in = NULL, *out = NULL;

  {
    if (signature->type != V_ASN1_BIT_STRING) {
      OPENSSL_PUT_ERROR(ASN1, ASN1_R_WRONG_TYPE);
      goto err;
    }

    // Write out the requested copies of the AlgorithmIdentifier.
    if (algor1 && !x509_digest_sign_algorithm(ctx, algor1)) {
      goto err;
    }
    if (algor2 && !x509_digest_sign_algorithm(ctx, algor2)) {
      goto err;
    }

    int in_len = ASN1_item_i2d(reinterpret_cast<ASN1_VALUE *>(asn), &in, it);
    if (in_len < 0) {
      goto err;
    }

    EVP_PKEY *pkey = EVP_PKEY_CTX_get0_pkey(ctx->pctx);
    size_t out_len = EVP_PKEY_size(pkey);
    if (out_len > INT_MAX) {
      OPENSSL_PUT_ERROR(X509, ERR_R_OVERFLOW);
      goto err;
    }

    out = reinterpret_cast<uint8_t *>(OPENSSL_malloc(out_len));
    if (out == NULL) {
      goto err;
    }

    if (!EVP_DigestSign(ctx, out, &out_len, in, in_len)) {
      OPENSSL_PUT_ERROR(X509, ERR_R_EVP_LIB);
      goto err;
    }

    ASN1_STRING_set0(signature, out, (int)out_len);
    out = NULL;
    signature->flags &= ~(ASN1_STRING_FLAG_BITS_LEFT | 0x07);
    signature->flags |= ASN1_STRING_FLAG_BITS_LEFT;
    ret = (int)out_len;
  }

err:
  EVP_MD_CTX_cleanup(ctx);
  OPENSSL_free(in);
  OPENSSL_free(out);
  return ret;
}